

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void __thiscall
ByteCodeGenerator::EmitThis
          (ByteCodeGenerator *this,FuncInfo *funcInfo,RegSlot lhsLocation,RegSlot fromRegister)

{
  bool bVar1;
  BOOL BVar2;
  ModuleID C1;
  RegSlot fromRegister_local;
  RegSlot lhsLocation_local;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *this_local;
  
  bVar1 = Js::ParseableFunctionInfo::GetIsStrictMode(funcInfo->byteCodeFunction);
  if (((!bVar1) || (bVar1 = FuncInfo::IsGlobalFunction(funcInfo), bVar1)) ||
     (BVar2 = FuncInfo::IsLambda(funcInfo), BVar2 != 0)) {
    C1 = GetModuleID(this);
    Js::ByteCodeWriter::Reg2Int1(&this->m_writer,LdThis,lhsLocation,fromRegister,C1);
  }
  else if (lhsLocation != fromRegister) {
    Js::ByteCodeWriter::Reg2(&this->m_writer,Ld_A,lhsLocation,fromRegister);
  }
  return;
}

Assistant:

void ByteCodeGenerator::EmitThis(FuncInfo *funcInfo, Js::RegSlot lhsLocation, Js::RegSlot fromRegister)
{
    if (funcInfo->byteCodeFunction->GetIsStrictMode() && !funcInfo->IsGlobalFunction() && !funcInfo->IsLambda())
    {
        if (lhsLocation != fromRegister)
        {
            m_writer.Reg2(Js::OpCode::Ld_A, lhsLocation, fromRegister);
        }
    }
    else
    {
        m_writer.Reg2Int1(Js::OpCode::LdThis, lhsLocation, fromRegister, this->GetModuleID());
    }
}